

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool operator_float_div(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar1;
  gravity_value_t gVar2;
  gravity_value_t gVar3;
  char _buffer [4096];
  char local_1028 [4096];
  
  gVar3 = args[1];
  gVar2 = convert_value2float(vm,*args);
  if (gVar2.isa != (gravity_class_t *)0x0) {
    gVar3 = convert_value2float(vm,gVar3);
    aVar1 = gVar3.field_1;
    if (gVar3.isa != (gravity_class_t *)0x0) {
      if ((aVar1.f != 0.0) || (NAN(aVar1.f))) {
        gVar3.field_1.f = gVar2.field_1.f / aVar1.f;
        gVar3.isa = gravity_class_float;
        gravity_vm_setslot(vm,gVar3,rindex);
        return true;
      }
      builtin_strncpy(local_1028,"Division by 0 error.",0x15);
      goto LAB_00128e42;
    }
  }
  builtin_strncpy(local_1028,"Unable to convert object to Float",0x22);
LAB_00128e42:
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,local_1028);
  gVar2.field_1.n = 0;
  gVar2.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar2,rindex);
  return false;
}

Assistant:

static bool operator_float_div (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v1, true);
    INTERNAL_CONVERT_FLOAT(v2, true);

    if (v2.f == 0.0) RETURN_ERROR("Division by 0 error.");
    RETURN_VALUE(VALUE_FROM_FLOAT(v1.f / v2.f), rindex);
}